

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp.c
# Opt level: O0

MPP_RET get_packet(Kmpp *ctx,MppPacket *packet)

{
  uint uVar1;
  MPP_RET MVar2;
  long lVar3;
  void *__dest;
  MppMeta meta_00;
  MppMeta meta;
  void *dst;
  RK_U32 len;
  void *ptr;
  MppPacket pkt;
  VencPacket *venc_packet;
  fd_set *__arr;
  undefined1 local_b8 [4];
  uint __i;
  fd_set read_fds;
  timeval timeout;
  RK_S32 ret;
  MppPacket *packet_local;
  Kmpp *ctx_local;
  
  if (ctx == (Kmpp *)0x0) {
    ctx_local._4_4_ = MPP_ERR_VALUE;
  }
  else if (ctx->mInitDone == 0) {
    ctx_local._4_4_ = MPP_ERR_INIT;
  }
  else {
    venc_packet = (VencPacket *)local_b8;
    for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
      *(undefined8 *)((long)venc_packet->packet + (ulong)__arr._4_4_ * 8 + -0x38) = 0;
    }
    lVar3 = (long)(ctx->mClientFd / 0x40);
    read_fds.__fds_bits[lVar3 + -1] =
         1L << ((byte)((long)ctx->mClientFd % 0x40) & 0x3f) | read_fds.__fds_bits[lVar3 + -1];
    read_fds.__fds_bits[0xf] = (ctx->mTimeout).tv_sec;
    uVar1 = select(ctx->mClientFd + 1,(fd_set *)local_b8,(fd_set *)0x0,(fd_set *)0x0,
                   (timeval *)(read_fds.__fds_bits + 0xf));
    if ((int)uVar1 < 1) {
      _mpp_log_l(2,"kmpp","get venc stream error %d\n",(char *)0x0,(ulong)uVar1);
      ctx_local._4_4_ = MPP_NOK;
    }
    else {
      if ((read_fds.__fds_bits[(long)(ctx->mClientFd / 0x40) + -1] &
          1L << ((byte)((long)ctx->mClientFd % 0x40) & 0x3f)) != 0) {
        pkt = mpp_mem_pool_get_f("get_packet",ctx->mVencPacketPool);
        MVar2 = mpp_vcodec_ioctl(ctx->mClientFd,0x601,0,0xb8,pkt);
        if (MVar2 != MPP_OK) {
          _mpp_log_l(2,"kmpp","chan %d VCODEC_CHAN_OUT_STRM_BUF_RDY failed\n",(char *)0x0,
                     (ulong)(uint)ctx->mChanId);
          return MPP_NOK;
        }
        if (*(int *)((long)pkt + 0x10) != 0) {
          ptr = (void *)0x0;
          uVar1 = *(uint *)((long)pkt + 0x10);
          lVar3 = *pkt;
          if (lVar3 != 0) {
            if (ctx->mPacket == (MppPacket)0x0) {
              mpp_packet_init(&ptr,(void *)(lVar3 + (ulong)*(uint *)((long)pkt + 0x30)),(ulong)uVar1
                             );
              mpp_packet_set_release(ptr,kmpp_release_venc_packet,ctx,pkt);
            }
            else {
              ptr = ctx->mPacket;
              ctx->mPacket = (MppPacket)0x0;
              __dest = mpp_packet_get_pos(ptr);
              memcpy(__dest,(void *)(lVar3 + (ulong)*(uint *)((long)pkt + 0x30)),(ulong)uVar1);
              mpp_vcodec_ioctl(ctx->mClientFd,0x602,0,0xb8,pkt);
              mpp_packet_set_length(ptr,(ulong)uVar1);
              mpp_mem_pool_put_f("get_packet",ctx->mVencPacketPool,pkt);
            }
            mpp_packet_set_dts(ptr,*(RK_S64 *)((long)pkt + 0x20));
            mpp_packet_set_pts(ptr,*(RK_S64 *)((long)pkt + 0x18));
            mpp_packet_set_flag(ptr,*(RK_U32 *)((long)pkt + 0x28));
            if ((*(uint *)((long)pkt + 0x28) & 0x10) != 0) {
              meta_00 = mpp_packet_get_meta(ptr);
              mpp_meta_set_s32(meta_00,KEY_OUTPUT_INTRA,1);
            }
          }
          *packet = ptr;
        }
      }
      ctx_local._4_4_ = MPP_OK;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static MPP_RET get_packet(Kmpp *ctx, MppPacket *packet)
{
    RK_S32 ret;

    if (!ctx)
        return MPP_ERR_VALUE;

    if (!ctx->mInitDone)
        return MPP_ERR_INIT;

    struct timeval timeout;
    fd_set read_fds;

    FD_ZERO(&read_fds);
    FD_SET(ctx->mClientFd, &read_fds);

    memcpy(&timeout, &ctx->mTimeout, sizeof(timeout));
    ret = select(ctx->mClientFd + 1, &read_fds, NULL, NULL, &timeout);
    if (ret <= 0) {
        mpp_err("get venc stream error %d\n", ret);
        return MPP_NOK;
    }

    if (FD_ISSET(ctx->mClientFd, &read_fds)) {
        VencPacket *venc_packet = mpp_mem_pool_get(ctx->mVencPacketPool);

        ret = mpp_vcodec_ioctl(ctx->mClientFd, VCODEC_CHAN_OUT_STRM_BUF_RDY, 0, sizeof(VencPacket), venc_packet);
        if (ret) {
            mpp_err("chan %d VCODEC_CHAN_OUT_STRM_BUF_RDY failed\n", ctx->mChanId);
            return MPP_NOK;
        }

        if (venc_packet->len) {
            MppPacket pkt = NULL;
            void *ptr = NULL;
            RK_U32 len = venc_packet->len;

            ptr = (void *)(intptr_t)(venc_packet->u64priv_data);

            if (ptr) {
                if (ctx->mPacket) {
                    void *dst;

                    pkt = ctx->mPacket;
                    ctx->mPacket = NULL;
                    dst = mpp_packet_get_pos(pkt);
                    memcpy(dst, ptr + venc_packet->offset, len);
                    mpp_vcodec_ioctl(ctx->mClientFd, VCODEC_CHAN_OUT_STRM_END, 0, sizeof(VencPacket), venc_packet);
                    mpp_packet_set_length(pkt, len);
                    mpp_mem_pool_put(ctx->mVencPacketPool, venc_packet);
                } else {
                    mpp_packet_init(&pkt, ptr + venc_packet->offset, len);
                    mpp_packet_set_release(pkt, kmpp_release_venc_packet, ctx, venc_packet);
                }
                mpp_packet_set_dts(pkt, venc_packet->u64dts);
                mpp_packet_set_pts(pkt, venc_packet->u64pts);
                mpp_packet_set_flag(pkt, venc_packet->flag);
                if (venc_packet->flag & MPP_PACKET_FLAG_INTRA) {
                    MppMeta meta = mpp_packet_get_meta(pkt);

                    mpp_meta_set_s32(meta, KEY_OUTPUT_INTRA, 1);
                }
            }
            *packet = pkt;
        }
    }

    return MPP_OK;
}